

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qthreadstorage.cpp
# Opt level: O0

void anon_unknown.dwarf_f048ff::Q_QGS_destructors::innerFunction(void *pointer)

{
  void *in_RDI;
  
  memset(in_RDI,0,0x18);
  QList<void_(*)(void_*)>::QList((QList<void_(*)(void_*)> *)0x6d72d9);
  return;
}

Assistant:

QThreadStorageData::QThreadStorageData(void (*func)(void *))
{
    QMutexLocker locker(&destructorsMutex);
    DestructorMap *destr = destructors();
    if (!destr) {
        /*
         the destructors vector has already been destroyed, yet a new
         QThreadStorage is being allocated. this can only happen during global
         destruction, at which point we assume that there is only one thread.
         in order to keep QThreadStorage working, we need somewhere to store
         the data, best place we have in this situation is at the tail of the
         current thread's tls vector. the destructor is ignored, since we have
         no where to store it, and no way to actually call it.
         */
        QThreadData *data = QThreadData::current();
        id = data->tls.size();
        DEBUG_MSG("QThreadStorageData: Allocated id %d, destructor %p cannot be stored", id, func);
        return;
    }
    for (id = 0; id < destr->size(); id++) {
        if (destr->at(id) == nullptr)
            break;
    }
    if (id == destr->size()) {
        destr->append(func);
    } else {
        (*destr)[id] = func;
    }
    DEBUG_MSG("QThreadStorageData: Allocated id %d, destructor %p", id, func);
}